

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  ParseInfoTree *pPVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_f8;
  string local_d8;
  undefined4 local_b8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  string local_58 [8];
  string delimeter;
  ParseInfoTree *parent;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  ParserImpl *this_local;
  
  delimeter.field_2._8_8_ = this->parse_info_tree_;
  if ((ParseInfoTree *)delimeter.field_2._8_8_ != (ParseInfoTree *)0x0) {
    pPVar3 = CreateNested((ParseInfoTree *)delimeter.field_2._8_8_,field);
    this->parse_info_tree_ = pPVar3;
  }
  std::__cxx11::string::string(local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"<",&local_79);
  bVar1 = TryConsume(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  if (bVar1) {
    std::__cxx11::string::operator=(local_58,">");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"{",&local_b1);
    bVar1 = Consume(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_002c81f4;
    }
    std::__cxx11::string::operator=(local_58,"}");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    iVar2 = (*reflection->_vptr_Reflection[0x41])(reflection,message,field,0);
    std::__cxx11::string::string((string *)&local_d8,local_58);
    bVar1 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var,iVar2),&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_002c81f4;
    }
  }
  else {
    iVar2 = (*reflection->_vptr_Reflection[0x21])(reflection,message,field,0);
    std::__cxx11::string::string((string *)&local_f8,local_58);
    bVar1 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var_00,iVar2),&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_002c81f4;
    }
  }
  this->parse_info_tree_ = (ParseInfoTree *)delimeter.field_2._8_8_;
  this_local._7_1_ = true;
LAB_002c81f4:
  local_b8 = 1;
  std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

bool ConsumeFieldMessage(Message* message,
                           const Reflection* reflection,
                           const FieldDescriptor* field) {

    // If the parse information tree is not NULL, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != NULL) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    string delimeter;
    if (TryConsume("<")) {
      delimeter = ">";
    } else {
      DO(Consume("{"));
      delimeter = "}";
    }

    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field), delimeter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field),
                        delimeter));
    }

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }